

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Read
          (ON_PhysicallyBasedMaterialUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  bool local_25;
  int local_24;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int chunk_version;
  ON_BinaryArchive *archive_local;
  ON_PhysicallyBasedMaterialUserData *this_local;
  
  local_24 = 0;
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_24);
  if (bVar1) {
    local_25 = false;
    if ((local_24 == 1) || (local_24 == 2)) {
      local_25 = Parameters::Read(&this->m_parameters,pOStack_20,local_24);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
    if (!bVar1) {
      local_25 = false;
    }
    iVar2 = (*(this->super_ON_UserData).super_ON_Object._vptr_ON_Object[6])(this,0);
    ON_REMOVE_ASAP_AssertEx
              ((uint)((byte)iVar2 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x21f6,"","IsValid() is false");
    this_local._7_1_ = local_25;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(ON_BinaryArchive& archive) override
  {
    int chunk_version = 0;
    if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
      return false;

    bool rc = false;

    if (chunk_version == 1 || chunk_version == 2)
    {
      rc = m_parameters.Read(archive, chunk_version);
    }

    if (!archive.EndRead3dmChunk())
    {
      rc = false;
    }

    ON_ASSERT(IsValid());
    return rc;
  }